

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O1

void __thiscall
adios2::core::Engine::Engine
          (Engine *this,string *engineType,IO *io,string *name,Mode openMode,Comm *comm,char *md,
          size_t mdsize)

{
  pointer pcVar1;
  UserOptions *pUVar2;
  HostOptions *pHVar3;
  string local_50;
  
  this->_vptr_Engine = (_func_int **)&PTR__Engine_0087b7a8;
  (this->m_EngineType)._M_dataplus._M_p = (pointer)&(this->m_EngineType).field_2;
  pcVar1 = (engineType->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_EngineType,pcVar1,pcVar1 + engineType->_M_string_length);
  this->m_IO = io;
  (this->m_Name)._M_dataplus._M_p = (pointer)&(this->m_Name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_Name,pcVar1,pcVar1 + name->_M_string_length);
  this->m_OpenMode = openMode;
  helper::Comm::Comm(&this->m_Comm,comm);
  pUVar2 = ADIOS::GetUserOptions(io->m_ADIOS);
  this->m_UserOptions = pUVar2;
  pHVar3 = ADIOS::GetHostOptions_abi_cxx11_(io->m_ADIOS);
  this->m_HostOptions = pHVar3;
  this->m_AdvanceStatus = OK;
  this->m_IsClosed = false;
  this->m_Steps = 0;
  this->m_IsOpen = false;
  this->m_FailVerbose = true;
  this->m_WriterDefinitionsLocked = false;
  this->m_ReaderSelectionsLocked = false;
  this->m_BetweenStepPairs = false;
  (this->m_CreatedVars)._M_h._M_buckets = &(this->m_CreatedVars)._M_h._M_single_bucket;
  (this->m_CreatedVars)._M_h._M_bucket_count = 1;
  (this->m_CreatedVars)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_CreatedVars)._M_h._M_element_count = 0;
  (this->m_CreatedVars)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_CreatedVars)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_CreatedVars)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Engine with metadata in memory","");
  ThrowUp(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

Engine::Engine(const std::string engineType, IO &io, const std::string &name, const Mode openMode,
               helper::Comm comm, const char *md, const size_t mdsize)
: m_EngineType(engineType), m_IO(io), m_Name(name), m_OpenMode(openMode), m_Comm(std::move(comm)),
  m_UserOptions(io.m_ADIOS.GetUserOptions()), m_HostOptions(io.m_ADIOS.GetHostOptions())
{
    ThrowUp("Engine with metadata in memory");
}